

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O2

long __thiscall
duckdb::DateDiffTernaryOperator::
Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long>
          (DateDiffTernaryOperator *this,string_t part,timestamp_t startdate,timestamp_t enddate,
          ValidityMask *mask,idx_t idx)

{
  bool bVar1;
  DatePartSpecifier DVar2;
  int64_t iVar3;
  NotImplementedException *this_00;
  timestamp_t input;
  allocator local_79;
  string_t part_local;
  string local_68;
  string local_48;
  
  input.value = part.value._8_8_;
  part_local.value.pointer.ptr = (char *)part.value._0_8_;
  part_local.value._0_8_ = this;
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(input);
  if ((bVar1) && (bVar1 = Value::IsFinite<duckdb::timestamp_t>(startdate), bVar1)) {
    string_t::GetString_abi_cxx11_(&local_68,&part_local);
    DVar2 = GetDatePartSpecifier(&local_68);
    switch(DVar2) {
    case BEGIN_BIGINT:
      iVar3 = DateDiff::YearOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case MONTH:
      iVar3 = DateDiff::MonthOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case DAY:
    case DOW:
    case ISODOW:
    case DOY:
    case JULIAN_DAY:
      iVar3 = DateDiff::DayOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case DECADE:
      iVar3 = DateDiff::DecadeOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case CENTURY:
      iVar3 = DateDiff::CenturyOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case MILLENNIUM:
      iVar3 = DateDiff::MilleniumOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case MICROSECONDS:
      iVar3 = DateDiff::MicrosecondsOperator::
              Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>(input,startdate);
      break;
    case MILLISECONDS:
      iVar3 = DateDiff::MillisecondsOperator::
              Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>(input,startdate);
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      iVar3 = DateDiff::SecondsOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case MINUTE:
      iVar3 = DateDiff::MinutesOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case HOUR:
      iVar3 = DateDiff::HoursOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case WEEK:
    case YEARWEEK:
      iVar3 = DateDiff::WeekOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case ISOYEAR:
      iVar3 = DateDiff::ISOYearOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    case QUARTER:
      iVar3 = DateDiff::QuarterOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (input,startdate);
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Specifier type not implemented for DATEDIFF",&local_79);
      NotImplementedException::NotImplementedException(this_00,&local_48);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              ((TemplatedValidityMask<unsigned_long> *)enddate.value,(idx_t)mask);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return DifferenceDates<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}